

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall
QApplicationPrivate::sendSyntheticEnterLeave(QApplicationPrivate *this,QWidget *widget)

{
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  QPoint QVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  double local_a8;
  double local_a0;
  QMouseEvent e;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((widget != (QWidget *)0x0) &&
     (pQVar1 = widget->data,
     ((pQVar1->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    if (((pQVar1->widget_attributes & 0x8000) == 0) || ((pQVar1->field_0x12 & 4) != 0)) {
      if ((qt_last_mouse_receiver.wp.d == (Data *)0x0) ||
         (pQVar4 = (QWidget *)qt_last_mouse_receiver.wp.value,
         *(int *)(qt_last_mouse_receiver.wp.d + 4) == 0)) {
        pQVar4 = (QWidget *)0x0;
      }
      if (pQVar4 != widget) goto LAB_002bef13;
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if ((*(byte *)(*(long *)(*(long *)(*(long *)&widget->field_0x8 + 0x10) + 0x20) + 0x11) & 4) !=
          0) goto LAB_002bef13;
    }
    pQVar4 = QWidget::mouseGrabber();
    if (((pQVar4 == (QWidget *)0x0 || pQVar4 == widget) &&
        (pQVar4 = QWidget::window(widget), (*(ushort *)&pQVar4->data->field_0x11 & 0x402) == 0)) &&
       ((!bVar3 ||
        ((bVar2 = QPointer::operator_cast_to_bool((QPointer *)&qt_last_mouse_receiver), bVar2 &&
         (pQVar5 = QWidget::window((QWidget *)qt_last_mouse_receiver.wp.value), pQVar5 == pQVar4))))
       )) {
      local_40 = (QPoint)QCursor::pos();
      local_48 = QWidget::mapFromGlobal(pQVar4,&local_40);
      _e = (undefined1 *)(double)local_48.xp.m_i.m_i;
      pQVar5 = QWidgetPrivate::childAt_helper
                         (*(QWidgetPrivate **)&pQVar4->field_0x8,(QPointF *)&e,
                          (bool)((byte)(*(uint *)&widget->data->field_0x10 >> 0x12) & 1));
      if (pQVar5 == (QWidget *)0x0) {
        pQVar5 = pQVar4;
      }
      QVar6 = QWidget::mapFrom(pQVar5,pQVar4,&local_48);
      if ((!bVar3 || pQVar5 == widget) || (bVar3 = QWidget::isAncestorOf(widget,pQVar5), bVar3)) {
        if (((widget->data->field_0x12 & 4) != 0) && (qt_button_down == widget)) {
          qt_button_down = (QWidget *)0x0;
        }
        _e = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = (double)QVar6.xp.m_i.m_i;
        local_a0 = (double)QVar6.yp.m_i.m_i;
        local_b8._8_4_ = SUB84((double)local_48.yp.m_i.m_i,0);
        local_b8._0_8_ = (double)local_48.xp.m_i.m_i;
        local_b8._12_4_ = (int)((ulong)(double)local_48.yp.m_i.m_i >> 0x20);
        local_c8._8_4_ = SUB84((double)local_40.yp.m_i.m_i,0);
        local_c8._0_8_ = (double)local_40.xp.m_i.m_i;
        local_c8._12_4_ = (int)((ulong)(double)local_40.yp.m_i.m_i >> 0x20);
        local_e8.d = (Data *)0x0;
        local_e8.ptr = (char16_t *)0x0;
        local_e8.size = 0;
        uVar7 = QPointingDevice::primaryPointingDevice((QString *)&local_e8);
        QMouseEvent::QMouseEvent(&e,5,&local_a8,local_b8,local_c8,0,0,0,uVar7);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        sendMouseEvent(pQVar5,&e,pQVar5,pQVar4,&qt_button_down,&qt_last_mouse_receiver,true,true);
        QMouseEvent::~QMouseEvent(&e);
      }
    }
  }
LAB_002bef13:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::sendSyntheticEnterLeave(QWidget *widget)
{
#ifndef QT_NO_CURSOR
    if (!widget || widget->isWindow())
        return;
    const bool widgetInShow = widget->isVisible() && !widget->data->in_destructor;
    if (!widgetInShow && widget != qt_last_mouse_receiver)
        return; // Widget was not under the cursor when it was hidden/deleted.

    if (widgetInShow && widget->parentWidget()->data->in_show)
        return; // Ignore recursive show.

    QWidget *mouseGrabber = QWidget::mouseGrabber();
    if (mouseGrabber && mouseGrabber != widget)
        return; // Someone else has the grab; enter/leave should not occur.

    QWidget *tlw = widget->window();
    if (tlw->data->in_destructor || tlw->data->is_closing)
        return; // Closing down the business.

    if (widgetInShow && (!qt_last_mouse_receiver || qt_last_mouse_receiver->window() != tlw))
        return; // Mouse cursor not inside the widget's top-level.

    const QPoint globalPos(QCursor::pos());
    QPoint windowPos = tlw->mapFromGlobal(globalPos);

    // Find the current widget under the mouse. If this function was called from
    // the widget's destructor, we have to make sure childAt() doesn't take into
    // account widgets that are about to be destructed.
    QWidget *widgetUnderCursor = tlw->d_func()->childAt_helper(windowPos, widget->data->in_destructor);
    if (!widgetUnderCursor)
        widgetUnderCursor = tlw;
    QPoint pos = widgetUnderCursor->mapFrom(tlw, windowPos);

    if (widgetInShow && widgetUnderCursor != widget && !widget->isAncestorOf(widgetUnderCursor))
        return; // Mouse cursor not inside the widget or any of its children.

    if (widget->data->in_destructor && qt_button_down == widget)
        qt_button_down = nullptr;

    // A mouse move is not actually sent, but we utilize the sendMouseEvent() call to send the
    // enter/leave events as appropriate
    QMouseEvent e(QEvent::MouseMove, pos, windowPos, globalPos, Qt::NoButton, Qt::NoButton, Qt::NoModifier);
    sendMouseEvent(widgetUnderCursor, &e, widgetUnderCursor, tlw, &qt_button_down, qt_last_mouse_receiver, true, true);
#else // !QT_NO_CURSOR
    Q_UNUSED(widget);
#endif // QT_NO_CURSOR
}